

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_unvoiced_vowel.c
# Opt level: O1

void njd_set_unvoiced_vowel(NJD *njd)

{
  char *pcVar1;
  int iVar2;
  NJDNode *node;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  NJDNode *pNVar8;
  int index;
  int local_4b0;
  int flag1;
  int atype2;
  int midx2;
  int flag3;
  int size1;
  int atype3;
  int atype1;
  int midx3;
  int midx1;
  int size2;
  int size3;
  NJDNode *nlink2;
  NJDNode *nlink3;
  NJDNode *nlink1;
  char *mora3;
  char *mora2;
  char *mora1;
  char *local_450;
  NJDNode *local_448;
  size_t local_440;
  char buff [1024];
  
  mora1 = (char *)0x0;
  mora2 = (char *)0x0;
  mora3 = (char *)0x0;
  nlink1 = (NJDNode *)0x0;
  nlink2 = (NJDNode *)0x0;
  nlink3 = (NJDNode *)0x0;
  size1 = 0;
  size2 = 0;
  size3 = 0;
  flag1 = -1;
  local_4b0 = -1;
  flag3 = -1;
  midx1 = 0;
  midx2 = 1;
  midx3 = 2;
  atype1 = 0;
  atype2 = 0;
  atype3 = 0;
  pNVar8 = njd->head;
  do {
    if (pNVar8 == (NJDNode *)0x0) {
      return;
    }
    buff[0] = '\0';
    pcVar5 = NJDNode_get_pron(pNVar8);
    local_440 = strlen(pcVar5);
    if (0 < (int)local_440) {
      index = 0;
      local_448 = pNVar8;
      do {
        pNVar8 = local_448;
        if (mora1 == (char *)0x0) {
          get_mora_information(local_448,index,&mora1,&nlink1,&flag1,&size1,&midx1,&atype1);
        }
        pcVar5 = mora1;
        if (mora1 == (char *)0x0) {
          njd_set_unvoiced_vowel_cold_1();
          return;
        }
        if (mora2 == (char *)0x0) {
          midx2 = midx1 + 1;
          atype2 = atype1;
          get_mora_information(pNVar8,size1 + index,&mora2,&nlink2,&local_4b0,&size2,&midx2,&atype2)
          ;
        }
        if (mora3 == (char *)0x0) {
          midx3 = midx2 + 1;
          atype3 = atype2;
          get_mora_information
                    (pNVar8,size1 + index + size2,&mora3,&nlink3,&flag3,&size3,&midx3,&atype3);
        }
        pcVar1 = mora2;
        node = nlink3;
        pNVar8 = nlink2;
        local_450 = mora3;
        if ((((mora3 != (char *)0x0 && mora2 != (char *)0x0) &&
             (nlink2 != nlink3 && nlink1 == nlink2)) &&
            ((iVar3 = strcmp(pcVar5,anon_var_dwarf_135661 + 3), iVar3 == 0 ||
             (iVar3 = strcmp(pcVar5,anon_var_dwarf_12ec4c), iVar3 == 0)))) &&
           (iVar3 = strcmp(pcVar1,anon_var_dwarf_139355 + 0xc), iVar3 == 0)) {
          pcVar6 = NJDNode_get_pos(pNVar8);
          iVar3 = strcmp(pcVar6,anon_var_dwarf_137e45 + 3);
          if (iVar3 != 0) {
            pcVar6 = NJDNode_get_pos(pNVar8);
            iVar3 = strcmp(pcVar6,anon_var_dwarf_1393ad + 6);
            if (iVar3 != 0) {
              pcVar6 = NJDNode_get_pos(pNVar8);
              iVar3 = strcmp(pcVar6,anon_var_dwarf_137e45);
              if (iVar3 != 0) goto LAB_0017292e;
            }
          }
          pcVar6 = NJDNode_get_pron(node);
          iVar3 = strcmp(pcVar6,anon_var_dwarf_9b0 + 0x12);
          if (iVar3 != 0) {
            pcVar6 = NJDNode_get_pron(node);
            iVar3 = strcmp(pcVar6,anon_var_dwarf_135003 + 6);
            if (iVar3 != 0) {
              local_4b0 = 1;
              goto LAB_0017292e;
            }
          }
          local_4b0 = 0;
        }
LAB_0017292e:
        pNVar8 = nlink2;
        iVar2 = flag3;
        iVar3 = flag1;
        if ((((pcVar1 != (char *)0x0) && (flag1 != 1)) && (local_4b0 == -1)) && (flag3 != 1)) {
          pcVar6 = NJDNode_get_pron(nlink2);
          iVar4 = strcmp(pcVar6,anon_var_dwarf_1393c3 + 0xf);
          if (iVar4 == 0) {
            pcVar6 = NJDNode_get_pos(pNVar8);
            iVar4 = strcmp(pcVar6,anon_var_dwarf_137e45 + 3);
            if (iVar4 != 0) {
              pcVar6 = NJDNode_get_pos(pNVar8);
              iVar4 = strcmp(pcVar6,anon_var_dwarf_1393ad + 6);
              if (iVar4 != 0) {
                pcVar6 = NJDNode_get_pos(pNVar8);
                iVar4 = strcmp(pcVar6,anon_var_dwarf_138ed4 + 10);
                if (iVar4 != 0) goto LAB_00172974;
              }
            }
            iVar4 = 0;
            if (atype2 != midx2 + 1) {
              iVar4 = apply_unvoice_rule(pcVar1,local_450);
            }
            local_4b0 = iVar4;
            if (iVar4 == 1) {
              if (iVar3 == -1) {
                flag1 = 0;
              }
              if (iVar2 == -1) {
                flag3 = 0;
              }
            }
          }
        }
LAB_00172974:
        if (flag1 == -1) {
          pcVar6 = NJDNode_get_pos(nlink1);
          iVar3 = strcmp(pcVar6,anon_var_dwarf_131f85);
          if (((iVar3 == 0) || (local_4b0 == 1)) || (atype1 == midx1 + 1)) {
            flag1 = 0;
          }
          else {
            flag1 = apply_unvoice_rule(pcVar5,pcVar1);
          }
        }
        iVar3 = flag1;
        if (local_4b0 == -1 && flag1 == 1) {
          local_4b0 = 0;
        }
        strcat(buff,pcVar5);
        if (iVar3 == 1) {
          sVar7 = strlen(buff);
          builtin_strncpy(buff + sVar7,"’",4);
        }
        index = index + size1;
        mora1 = pcVar1;
        nlink1 = nlink2;
        size1 = size2;
        flag1 = local_4b0;
        midx1 = midx2;
        atype1 = atype2;
        mora2 = local_450;
        nlink2 = nlink3;
        size2 = size3;
        local_4b0 = flag3;
        midx2 = midx3;
        atype2 = atype3;
        mora3 = (char *)0x0;
        nlink3 = (NJDNode *)0x0;
        size3 = 0;
        flag3 = -1;
        midx3 = 0;
        atype3 = 0;
        pNVar8 = local_448;
      } while (index < (int)local_440);
    }
    NJDNode_set_pron(pNVar8,buff);
    pNVar8 = pNVar8->next;
  } while( true );
}

Assistant:

void njd_set_unvoiced_vowel(NJD * njd)
{
   NJDNode *node;
   int index;
   int len;
   char buff[MAXBUFLEN];
   const char *str;

   /* mora information for current, next, and next-next moras */
   const char *mora1 = NULL, *mora2 = NULL, *mora3 = NULL;
   NJDNode *nlink1 = NULL, *nlink2 = NULL, *nlink3 = NULL;
   int size1 = 0, size2 = 0, size3 = 0;
   int flag1 = -1, flag2 = -1, flag3 = -1;      /* unknown:-1, voice:0, unvoiced:1 */
   int midx1 = 0, midx2 = 1, midx3 = 2;
   int atype1 = 0, atype2 = 0, atype3 = 0;

   for (node = njd->head; node != NULL; node = node->next) {
      buff[0] = '\0';

      /* get pronunciation */
      str = NJDNode_get_pron(node);
      len = strlen(str);

      /* parse pronunciation */
      for (index = 0; index < len;) {
         /* get mora information */
         if (mora1 == NULL)
            get_mora_information(node, index, &mora1, &nlink1, &flag1, &size1, &midx1, &atype1);
         if (mora1 == NULL) {
            fprintf(stderr,
                    "WARNING: set_unvoiced_vowel() in njd_set_unvoiced_vowel.c: Wrong pron.");
            return;
         }
         if (mora2 == NULL) {
            midx2 = midx1 + 1;
            atype2 = atype1;
            get_mora_information(node, index + size1, &mora2, &nlink2, &flag2, &size2, &midx2,
                                 &atype2);
         }
         if (mora3 == NULL) {
            midx3 = midx2 + 1;
            atype3 = atype2;
            get_mora_information(node, index + size1 + size2, &mora3, &nlink3, &flag3, &size3,
                                 &midx3, &atype3);
         }

         /* rule 1: look-ahead for 'masu' and 'desu' */
         if (mora2 != NULL && mora3 != NULL && nlink1 == nlink2 && nlink2 != nlink3 &&
             (strcmp(mora1, NJD_SET_UNVOICED_VOWEL_MA) == 0
              || strcmp(mora1, NJD_SET_UNVOICED_VOWEL_DE) == 0)
             && strcmp(mora2, NJD_SET_UNVOICED_VOWEL_SU) == 0
             && (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0
                 || strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_KANDOUSHI) == 0)
             ) {
            if (strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_QUESTION) == 0
                || strcmp(NJDNode_get_pron(nlink3), NJD_SET_UNVOICED_VOWEL_CHOUON) == 0)
               flag2 = 0;
            else
               flag2 = 1;
         }

         /* rule 2: look-ahead for 'shi' */
         if (flag1 != 1 && flag2 == -1 && flag3 != 1 && mora2 != NULL &&
             strcmp(NJDNode_get_pron(nlink2), NJD_SET_UNVOICED_VOWEL_SHI) == 0 &&
             (strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_DOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JODOUSHI) == 0 ||
              strcmp(NJDNode_get_pos(nlink2), NJD_SET_UNVOICED_VOWEL_JOSHI) == 0)) {
            if (atype2 == midx2 + 1) {
               /* rule 4 */
               flag2 = 0;
            } else {
               /* rule 5 */
               flag2 = apply_unvoice_rule(mora2, mora3);
            }
            if (flag2 == 1) {
               if (flag1 == -1)
                  flag1 = 0;
               if (flag3 == -1)
                  flag3 = 0;
            }
         }

         /* estimate unvoice */
         if (flag1 == -1) {
            if (strcmp(NJDNode_get_pos(nlink1), NJD_SET_UNVOICED_VOWEL_FILLER) == 0) {
               /* rule 0 */
               flag1 = 0;
            } else if (flag2 == 1) {
               /* rule 3 */
               flag1 = 0;
            } else if (atype1 == midx1 + 1) {
               /* rule 4 */
               flag1 = 0;
            } else {
               /* rule 5 */
               flag1 = apply_unvoice_rule(mora1, mora2);
            }
         }
         if (flag1 == 1 && flag2 == -1) {
            flag2 = 0;
         }

         /* store pronunciation */
         strcat(buff, mora1);
         if (flag1 == 1)
            strcat(buff, NJD_SET_UNVOICED_VOWEL_QUOTATION);

         /* prepare next step */
         index += size1;

         mora1 = mora2;
         nlink1 = nlink2;
         size1 = size2;
         flag1 = flag2;
         midx1 = midx2;
         atype1 = atype2;

         mora2 = mora3;
         nlink2 = nlink3;
         size2 = size3;
         flag2 = flag3;
         midx2 = midx3;
         atype2 = atype3;

         mora3 = NULL;
         nlink3 = NULL;
         size3 = 0;
         flag3 = -1;
         midx3 = 0;
         atype3 = 0;
      }

      NJDNode_set_pron(node, buff);
   }
}